

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

void JPCommonLabel_fprint(JPCommonLabel *label,FILE *fp)

{
  FILE *in_RSI;
  long in_RDI;
  int j;
  int i;
  JPCommonLabelBreathGroup *b;
  JPCommonLabelAccentPhrase *a;
  JPCommonLabelWord *w;
  JPCommonLabelMora *m;
  JPCommonLabelPhoneme *p;
  long *local_38;
  long local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_38 = *(long **)(in_RDI + 0x10);
  do {
    if (local_38 == (long *)0x0) {
      return;
    }
    fprintf(in_RSI,"%d\n");
    for (local_30 = *local_38; local_30 != 0; local_30 = *(long *)(local_30 + 0x28)) {
      fprintf(in_RSI,"   %d\n");
      for (local_28 = *(undefined8 **)(local_30 + 0x10); local_28 != (undefined8 *)0x0;
          local_28 = (undefined8 *)local_28[7]) {
        fprintf(in_RSI,"      %s %s %s %s\n",*local_28,local_28[1],local_28[2],local_28[3]);
        for (local_20 = (undefined8 *)local_28[4]; local_20 != (undefined8 *)0x0;
            local_20 = (undefined8 *)local_20[4]) {
          fprintf(in_RSI,"         %s\n",*local_20);
          for (local_18 = (undefined8 *)local_20[1];
              (local_18 != (undefined8 *)0x0 &&
              (fprintf(in_RSI,"            %s\n",*local_18), local_18 != (undefined8 *)local_20[2]))
              ; local_18 = (undefined8 *)local_18[2]) {
          }
          if (local_20 == (undefined8 *)local_28[5]) break;
        }
        if (local_28 == *(undefined8 **)(local_30 + 0x18)) break;
      }
      if (local_30 == local_38[1]) break;
    }
    local_38 = (long *)local_38[3];
  } while( true );
}

Assistant:

void JPCommonLabel_fprint(JPCommonLabel * label, FILE * fp)
{
   JPCommonLabelPhoneme *p;
   JPCommonLabelMora *m;
   JPCommonLabelWord *w;
   JPCommonLabelAccentPhrase *a;
   JPCommonLabelBreathGroup *b;
   int i = 0;
   int j = 0;

   for (b = label->breath_head; b != NULL; b = b->next) {
      fprintf(fp, "%d\n", j++);
      for (a = b->head; a != NULL; a = a->next) {
         fprintf(fp, "   %d\n", i++);
         for (w = a->head; w != NULL; w = w->next) {
            fprintf(fp, "      %s %s %s %s\n", w->pron, w->pos, w->ctype, w->cform);
            for (m = w->head; m != NULL; m = m->next) {
               fprintf(fp, "         %s\n", m->mora);
               for (p = m->head; p != NULL; p = p->next) {
                  fprintf(fp, "            %s\n", p->phoneme);
                  if (p == m->tail)
                     break;
               }
               if (m == w->tail)
                  break;
            }
            if (w == a->tail)
               break;
         }
         if (a == b->tail)
            break;
      }
   }
}